

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O2

int32_t ucal_getDefaultTimeZone_63(UChar *result,int32_t resultCapacity,UErrorCode *ec)

{
  int32_t iVar1;
  TimeZone *pTVar2;
  UnicodeString id;
  Char16Ptr local_80;
  UChar *local_78;
  UnicodeString local_68;
  
  iVar1 = 0;
  if ((ec != (UErrorCode *)0x0) && (iVar1 = 0, *ec < U_ILLEGAL_ARGUMENT_ERROR)) {
    pTVar2 = icu_63::TimeZone::createDefault();
    if (pTVar2 == (TimeZone *)0x0) {
      *ec = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      local_68.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003a7268
      ;
      local_68.fUnion.fStackFields.fLengthAndFlags = 2;
      icu_63::UnicodeString::operator=(&local_68,&pTVar2->fID);
      (*(pTVar2->super_UObject)._vptr_UObject[1])(pTVar2);
      local_80.p_ = result;
      iVar1 = icu_63::UnicodeString::extract(&local_68,&local_80,resultCapacity,ec);
      local_78 = local_80.p_;
      icu_63::UnicodeString::~UnicodeString(&local_68);
    }
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getDefaultTimeZone(UChar* result, int32_t resultCapacity, UErrorCode* ec) {
    int32_t len = 0;
    if (ec!=NULL && U_SUCCESS(*ec)) {
        TimeZone* zone = TimeZone::createDefault();
        if (zone == NULL) {
            *ec = U_MEMORY_ALLOCATION_ERROR;
        } else {
            UnicodeString id;
            zone->getID(id);
            delete zone;
            len = id.extract(result, resultCapacity, *ec);
        }
    }
    return len;
}